

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> __thiscall
llvm::yaml::Input::createHNodes(Input *this,Node *N)

{
  KeyValueNode *this_00;
  long *plVar1;
  undefined1 auVar2 [8];
  undefined4 uVar3;
  _func_int *__dest;
  ScalarNode *node;
  Node *pNVar4;
  void *pvVar5;
  _func_int **pp_Var6;
  char *__function;
  SequenceNode *in_RDX;
  ptrdiff_t _Num;
  ulong uVar7;
  ScalarNode *this_01;
  StringRef SVar8;
  StringRef Key;
  pair<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_bool>
  pVar9;
  undefined1 local_100 [8];
  SmallString<128U> StringStorage;
  Child local_50;
  iterator __begin4;
  iterator local_38;
  iterator __begin5;
  
  local_100 = (undefined1  [8])
              &StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.Size;
  StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  if (in_RDX == (SequenceNode *)0x0) {
    __assert_fail("Val && \"isa<> used on a null pointer\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                  ,0x69,
                  "static bool llvm::isa_impl_cl<llvm::yaml::ScalarNode, const llvm::yaml::Node *>::doit(const From *) [To = llvm::yaml::ScalarNode, From = const llvm::yaml::Node *]"
                 );
  }
  switch((in_RDX->super_Node).TypeID) {
  case 0:
    pp_Var6 = (_func_int **)operator_new(0x10);
    pp_Var6[1] = (_func_int *)in_RDX;
    *pp_Var6 = (_func_int *)&PTR_anchor_01079bc8;
    break;
  case 1:
    SVar8 = ScalarNode::getValue((ScalarNode *)in_RDX,(SmallVectorImpl<char> *)local_100);
    auVar2 = local_100;
    uVar3 = StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX._0_4_;
    uVar7 = (ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
            0xffffffff;
    if (uVar7 != 0) {
      pvVar5 = BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                          &N[1].Anchor,uVar7,(Align)0x0);
      SVar8.Length._0_4_ = uVar3;
      SVar8.Data = (char *)pvVar5;
      SVar8.Length._4_4_ = 0;
      memmove(pvVar5,(void *)auVar2,uVar7);
    }
    pNVar4 = (Node *)SVar8.Length;
    pp_Var6 = (_func_int **)operator_new(0x20);
    pp_Var6[1] = (_func_int *)in_RDX;
    *pp_Var6 = (_func_int *)&PTR_anchor_01079bf0;
    pp_Var6[2] = (_func_int *)SVar8.Data;
    goto LAB_00dabc5b;
  case 2:
    pNVar4 = in_RDX->CurrentEntry;
    if (pNVar4 == (Node *)0x0) {
      __dest = (_func_int *)0x0;
    }
    else {
      pvVar5 = *(void **)&in_RDX->SeqType;
      __dest = (_func_int *)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                          &N[1].Anchor,(size_t)pNVar4,(Align)0x0);
      memmove(__dest,pvVar5,(size_t)pNVar4);
    }
    pp_Var6 = (_func_int **)operator_new(0x20);
    pp_Var6[1] = (_func_int *)in_RDX;
    *pp_Var6 = (_func_int *)&PTR_anchor_01079bf0;
    pp_Var6[2] = __dest;
LAB_00dabc5b:
    pp_Var6[3] = (_func_int *)pNVar4;
    break;
  default:
    Twine::Twine((Twine *)&local_50,"unknown node kind");
    setError((Input *)N,&in_RDX->super_Node,(Twine *)&local_50);
    pp_Var6 = (_func_int **)0x0;
    break;
  case 4:
    pp_Var6 = (_func_int **)operator_new(0x100);
    pp_Var6[1] = (_func_int *)in_RDX;
    *pp_Var6 = (_func_int *)&PTR_anchor_01079c18;
    pp_Var6[2] = (_func_int *)0x0;
    pp_Var6[3] = (_func_int *)0x0;
    pp_Var6[4] = (_func_int *)0x1000000000;
    pp_Var6[6] = (_func_int *)(pp_Var6 + 8);
    pp_Var6[7] = (_func_int *)0x600000000;
    local_38 = begin<llvm::yaml::MappingNode>((MappingNode *)in_RDX);
    if (local_38.Base != (MappingNode *)0x0) {
      StringStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
      _120_8_ = pp_Var6 + 2;
      do {
        this_00 = (local_38.Base)->CurrentEntry;
        if (this_00 == (KeyValueNode *)0x0) {
          __function = 
          "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
          ;
LAB_00dabd33:
          __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                        ,0x150,__function);
        }
        node = (ScalarNode *)KeyValueNode::getKey(this_00);
        if (node == (ScalarNode *)0x0) {
          this_01 = (ScalarNode *)0x0;
        }
        else {
          this_01 = node;
          if ((node->super_Node).TypeID != 1) {
            this_01 = (ScalarNode *)0x0;
          }
        }
        pNVar4 = KeyValueNode::getValue(this_00);
        if ((this_01 == (ScalarNode *)0x0) || (pNVar4 == (Node *)0x0)) {
          if (this_01 == (ScalarNode *)0x0) {
            Twine::Twine((Twine *)&local_50,"Map key must be a scalar");
            setError((Input *)N,(Node *)node,(Twine *)&local_50);
          }
          if (pNVar4 == (Node *)0x0) {
            Twine::Twine((Twine *)&local_50,"Map value must not be empty");
            setError((Input *)N,(Node *)node,(Twine *)&local_50);
          }
          break;
        }
        StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX =
             (void *)((ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>
                             .super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX & 0xffffffff00000000);
        Key = ScalarNode::getValue(this_01,(SmallVectorImpl<char> *)local_100);
        auVar2 = local_100;
        uVar3 = StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX._0_4_;
        uVar7 = (ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
                0xffffffff;
        if (uVar7 != 0) {
          pvVar5 = BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                             ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                              &N[1].Anchor,uVar7,(Align)0x0);
          Key.Length._0_4_ = uVar3;
          Key.Data = (char *)pvVar5;
          Key.Length._4_4_ = 0;
          memmove(pvVar5,(void *)auVar2,uVar7);
        }
        createHNodes((Input *)&local_50,N);
        if (*(int *)&N[1].SourceRange.End.Ptr != 0) {
          if ((SequenceNode *)local_50.twine != (SequenceNode *)0x0) {
            (**(code **)(*local_50.decUL + 0x10))();
          }
          break;
        }
        pVar9 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                ::try_emplace<>((StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                                 *)StringStorage.super_SmallVector<char,_128U>.
                                   super_SmallVectorStorage<char,_128U>.InlineElts._120_8_,Key);
        plVar1 = *(long **)(*(long *)pVar9.first.
                                     super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                                     .Ptr.
                                     super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                           + 8);
        ((Child *)
        (*(long *)pVar9.first.
                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                  .Ptr.
                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
        + 8))->decUL = (unsigned_long *)local_50;
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x10))();
        }
        basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
                  (&stack0xffffffffffffffc8);
        if (local_38.Base == (MappingNode *)0x0) break;
      } while( true );
    }
    break;
  case 5:
    pp_Var6 = (_func_int **)operator_new(0x28);
    pp_Var6[1] = (_func_int *)in_RDX;
    *pp_Var6 = (_func_int *)&PTR_anchor_01079c40;
    pp_Var6[2] = (_func_int *)0x0;
    pp_Var6[3] = (_func_int *)0x0;
    pp_Var6[4] = (_func_int *)0x0;
    local_50 = (Child)begin<llvm::yaml::SequenceNode>(in_RDX);
    if ((SequenceNode *)local_50.twine != (SequenceNode *)0x0) {
      do {
        if ((Node *)local_50.twine[3].RHS.twine == (Node *)0x0) {
          __function = 
          "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
          ;
          goto LAB_00dabd33;
        }
        createHNodes((Input *)&stack0xffffffffffffffc8,N);
        if (*(int *)&N[1].SourceRange.End.Ptr != 0) {
          if (local_38.Base != (MappingNode *)0x0) {
            (*((local_38.Base)->super_Node)._vptr_Node[2])();
          }
          break;
        }
        std::
        vector<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>,std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>>
        ::
        emplace_back<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>
                  ((vector<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>,std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>>
                    *)(pp_Var6 + 2),
                   (unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                    *)&stack0xffffffffffffffc8);
        if (local_38.Base != (MappingNode *)0x0) {
          (*((local_38.Base)->super_Node)._vptr_Node[2])();
        }
        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++
                  ((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *)
                   &local_50);
      } while ((SequenceNode *)local_50.twine != (SequenceNode *)0x0);
    }
  }
  (this->super_IO)._vptr_IO = pp_Var6;
  if (local_100 !=
      (undefined1  [8])
      &StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)local_100);
  }
  return (__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
          )(__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Input::HNode> Input::createHNodes(Node *N) {
  SmallString<128> StringStorage;
  if (ScalarNode *SN = dyn_cast<ScalarNode>(N)) {
    StringRef KeyStr = SN->getValue(StringStorage);
    if (!StringStorage.empty()) {
      // Copy string to permanent storage
      KeyStr = StringStorage.str().copy(StringAllocator);
    }
    return std::make_unique<ScalarHNode>(N, KeyStr);
  } else if (BlockScalarNode *BSN = dyn_cast<BlockScalarNode>(N)) {
    StringRef ValueCopy = BSN->getValue().copy(StringAllocator);
    return std::make_unique<ScalarHNode>(N, ValueCopy);
  } else if (SequenceNode *SQ = dyn_cast<SequenceNode>(N)) {
    auto SQHNode = std::make_unique<SequenceHNode>(N);
    for (Node &SN : *SQ) {
      auto Entry = createHNodes(&SN);
      if (EC)
        break;
      SQHNode->Entries.push_back(std::move(Entry));
    }
    return std::move(SQHNode);
  } else if (MappingNode *Map = dyn_cast<MappingNode>(N)) {
    auto mapHNode = std::make_unique<MapHNode>(N);
    for (KeyValueNode &KVN : *Map) {
      Node *KeyNode = KVN.getKey();
      ScalarNode *Key = dyn_cast_or_null<ScalarNode>(KeyNode);
      Node *Value = KVN.getValue();
      if (!Key || !Value) {
        if (!Key)
          setError(KeyNode, "Map key must be a scalar");
        if (!Value)
          setError(KeyNode, "Map value must not be empty");
        break;
      }
      StringStorage.clear();
      StringRef KeyStr = Key->getValue(StringStorage);
      if (!StringStorage.empty()) {
        // Copy string to permanent storage
        KeyStr = StringStorage.str().copy(StringAllocator);
      }
      auto ValueHNode = createHNodes(Value);
      if (EC)
        break;
      mapHNode->Mapping[KeyStr] = std::move(ValueHNode);
    }
    return std::move(mapHNode);
  } else if (isa<NullNode>(N)) {
    return std::make_unique<EmptyHNode>(N);
  } else {
    setError(N, "unknown node kind");
    return nullptr;
  }
}